

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::NegativePartialUpdateTests::init(NegativePartialUpdateTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  NegativePartialUpdateTest *pNVar1;
  
  pNVar1 = (NegativePartialUpdateTest *)operator_new(0xa8);
  egl::anon_unknown_0::NegativePartialUpdateTest::NegativePartialUpdateTest
            (pNVar1,(this->super_TestCaseGroup).m_eglTestCtx,false,SURFACETYPE_PBUFFER,
             "not_postable_surface","Call setDamageRegion() on pbuffer");
  (pNVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_01e07990;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pNVar1 = (NegativePartialUpdateTest *)operator_new(0xa8);
  egl::anon_unknown_0::NegativePartialUpdateTest::NegativePartialUpdateTest
            (pNVar1,(this->super_TestCaseGroup).m_eglTestCtx,false,SURFACETYPE_WINDOW,
             "not_current_surface","Call setDamageRegion() on pbuffer");
  (pNVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_01e07a30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pNVar1 = (NegativePartialUpdateTest *)operator_new(0xa8);
  egl::anon_unknown_0::NegativePartialUpdateTest::NegativePartialUpdateTest
            (pNVar1,(this->super_TestCaseGroup).m_eglTestCtx,true,SURFACETYPE_WINDOW,
             "buffer_preserved","Call setDamageRegion() on pbuffer");
  (pNVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_01e07a80;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pNVar1 = (NegativePartialUpdateTest *)operator_new(0xa8);
  egl::anon_unknown_0::NegativePartialUpdateTest::NegativePartialUpdateTest
            (pNVar1,(this->super_TestCaseGroup).m_eglTestCtx,false,SURFACETYPE_WINDOW,
             "set_damage_region_twice","Call setDamageRegion() twice");
  (pNVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_01e07ad0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pNVar1 = (NegativePartialUpdateTest *)operator_new(0xa8);
  egl::anon_unknown_0::NegativePartialUpdateTest::NegativePartialUpdateTest
            (pNVar1,(this->super_TestCaseGroup).m_eglTestCtx,false,SURFACETYPE_WINDOW,
             "set_damage_region_before_query_age",
             "Call setDamageRegion() without querying buffer age");
  (pNVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_01e07b20;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pNVar1 = (NegativePartialUpdateTest *)operator_new(0xa8);
  egl::anon_unknown_0::NegativePartialUpdateTest::NegativePartialUpdateTest
            (pNVar1,(this->super_TestCaseGroup).m_eglTestCtx,false,SURFACETYPE_WINDOW,
             "pass_null_0_as_params","Call setDamageRegion() with (NULL, 0)");
  (pNVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_01e07b70;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pNVar1 = (NegativePartialUpdateTest *)operator_new(0xa8);
  egl::anon_unknown_0::NegativePartialUpdateTest::NegativePartialUpdateTest
            (pNVar1,(this->super_TestCaseGroup).m_eglTestCtx,false,SURFACETYPE_WINDOW,
             "not_current_surface2","Call setDamageRegion() on pbuffer");
  (pNVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativePartialUpdateTest_01e07bc0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  return extraout_EAX;
}

Assistant:

void NegativePartialUpdateTests::init (void)
{
	addChild(new NotPostableTest(m_eglTestCtx));
	addChild(new NotCurrentSurfaceTest(m_eglTestCtx));
	addChild(new BufferPreservedTest(m_eglTestCtx));
	addChild(new SetTwiceTest(m_eglTestCtx));
	addChild(new NoAgeTest(m_eglTestCtx));
	addChild(new PassNullTest(m_eglTestCtx));
	addChild(new NotCurrentSurfaceTest2(m_eglTestCtx));
}